

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void sanguine_blind(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  CHAR_DATA *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined2 in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffa6;
  char *in_stack_ffffffffffffffb8;
  
  init_affect((AFFECT_DATA *)0x61e016);
  bVar1 = is_affected(in_RSI,(int)gsn_blindness);
  if (!bVar1) {
    act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                         CONCAT24(in_stack_ffffffffffffffa4,
                                  CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
        in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
    act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                         CONCAT24(in_stack_ffffffffffffffa4,
                                  CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
        in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
    act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                         CONCAT24(in_stack_ffffffffffffffa4,
                                  CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
        in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffffa6,
                                  CONCAT24(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0))),
                 in_stack_ffffffffffffff98);
    palloc_string(in_stack_ffffffffffffffb8);
    number_percent();
    std::pow<int,int>(0,0x61e12a);
    affect_to_char(in_RDI,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void sanguine_blind(CHAR_DATA *ch, CHAR_DATA *victim)
{
	AFFECT_DATA af;
	init_affect(&af);

	if (is_affected(victim, gsn_blindness))
		return;

	act("You force your way through $n's undulating ward of blood to strike at $m.", ch, 0, victim, TO_VICT);
	act("$N struggles through $n's ward to strike at $m before stumbling away clawing at his eyes!", ch, 0, victim, TO_NOTVICT);
	act("$N struggles through your ward to strike at you before stumbling away clawing at his eyes!", ch, 0, victim, TO_CHAR);
	send_to_char("Your vision fades to blackness as the coagulated blood flows hungrily over your eyes!\n\r", victim);

	af.where = TO_AFFECTS;
	af.aftype = AFT_MALADY;
	af.type = gsn_blindness;
	af.name = palloc_string("infected eyes");
	af.level = ch->level;
	af.owner = ch;
	af.duration = number_percent() > 50 ? 1 : 0;
	af.location = 0;
	af.modifier = 0;
	af.mod_name = MOD_VISION;

	SET_BIT(af.bitvector, AFF_BLIND);

	affect_to_char(victim, &af);
}